

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int mbedtls_ctr_drbg_random_with_add
              (void *p_rng,uchar *output,size_t output_len,uchar *additional,size_t add_len)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  uchar add_input [48];
  uchar tmp [16];
  
  if (0x400 < output_len) {
    return -0x36;
  }
  if (0x100 < add_len) {
    return -0x38;
  }
  add_input[0x20] = '\0';
  add_input[0x21] = '\0';
  add_input[0x22] = '\0';
  add_input[0x23] = '\0';
  add_input[0x24] = '\0';
  add_input[0x25] = '\0';
  add_input[0x26] = '\0';
  add_input[0x27] = '\0';
  add_input[0x28] = '\0';
  add_input[0x29] = '\0';
  add_input[0x2a] = '\0';
  add_input[0x2b] = '\0';
  add_input[0x2c] = '\0';
  add_input[0x2d] = '\0';
  add_input[0x2e] = '\0';
  add_input[0x2f] = '\0';
  add_input[0x10] = '\0';
  add_input[0x11] = '\0';
  add_input[0x12] = '\0';
  add_input[0x13] = '\0';
  add_input[0x14] = '\0';
  add_input[0x15] = '\0';
  add_input[0x16] = '\0';
  add_input[0x17] = '\0';
  add_input[0x18] = '\0';
  add_input[0x19] = '\0';
  add_input[0x1a] = '\0';
  add_input[0x1b] = '\0';
  add_input[0x1c] = '\0';
  add_input[0x1d] = '\0';
  add_input[0x1e] = '\0';
  add_input[0x1f] = '\0';
  add_input[0] = '\0';
  add_input[1] = '\0';
  add_input[2] = '\0';
  add_input[3] = '\0';
  add_input[4] = '\0';
  add_input[5] = '\0';
  add_input[6] = '\0';
  add_input[7] = '\0';
  add_input[8] = '\0';
  add_input[9] = '\0';
  add_input[10] = '\0';
  add_input[0xb] = '\0';
  add_input[0xc] = '\0';
  add_input[0xd] = '\0';
  add_input[0xe] = '\0';
  add_input[0xf] = '\0';
  if ((*(int *)((long)p_rng + 0x20) < *(int *)((long)p_rng + 0x10)) ||
     (*(int *)((long)p_rng + 0x14) != 0)) {
    iVar2 = mbedtls_ctr_drbg_reseed((mbedtls_ctr_drbg_context *)p_rng,additional,add_len);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else if (add_len != 0) {
    block_cipher_df(add_input,additional,add_len);
    ctr_drbg_update_internal((mbedtls_ctr_drbg_context *)p_rng,add_input);
  }
  do {
    if (output_len == 0) {
      ctr_drbg_update_internal((mbedtls_ctr_drbg_context *)p_rng,add_input);
      *(int *)((long)p_rng + 0x10) = *(int *)((long)p_rng + 0x10) + 1;
      return 0;
    }
    lVar3 = 0xf;
    do {
      if (lVar3 == -1) break;
      pcVar1 = (char *)((long)p_rng + lVar3);
      *pcVar1 = *pcVar1 + '\x01';
      lVar3 = lVar3 + -1;
    } while (*pcVar1 == '\0');
    mbedtls_aes_crypt_ecb((mbedtls_aes_context *)((long)p_rng + 0x28),1,(uchar *)p_rng,tmp);
    __n = 0x10;
    if (output_len < 0x10) {
      __n = output_len;
    }
    memcpy(output,tmp,__n);
    output = output + __n;
    output_len = output_len - __n;
  } while( true );
}

Assistant:

int mbedtls_ctr_drbg_random_with_add( void *p_rng,
                              unsigned char *output, size_t output_len,
                              const unsigned char *additional, size_t add_len )
{
    int ret = 0;
    mbedtls_ctr_drbg_context *ctx = (mbedtls_ctr_drbg_context *) p_rng;
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = output;
    unsigned char tmp[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    int i;
    size_t use_len;

    if( output_len > MBEDTLS_CTR_DRBG_MAX_REQUEST )
        return( MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG );

    if( add_len > MBEDTLS_CTR_DRBG_MAX_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( add_input, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    if( ctx->reseed_counter > ctx->reseed_interval ||
        ctx->prediction_resistance )
    {
        if( ( ret = mbedtls_ctr_drbg_reseed( ctx, additional, add_len ) ) != 0 )
            return( ret );

        add_len = 0;
    }

    if( add_len > 0 )
    {
        block_cipher_df( add_input, additional, add_len );
        ctr_drbg_update_internal( ctx, add_input );
    }

    while( output_len > 0 )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT, ctx->counter, tmp );

        use_len = ( output_len > MBEDTLS_CTR_DRBG_BLOCKSIZE ) ? MBEDTLS_CTR_DRBG_BLOCKSIZE :
                                                       output_len;
        /*
         * Copy random block to destination
         */
        memcpy( p, tmp, use_len );
        p += use_len;
        output_len -= use_len;
    }

    ctr_drbg_update_internal( ctx, add_input );

    ctx->reseed_counter++;

    return( 0 );
}